

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_triangle_fan(rf_vec2 *points,int points_count,rf_color color)

{
  _Bool _Var1;
  long local_40;
  rf_int i;
  int points_count_local;
  rf_vec2 *points_local;
  rf_color color_local;
  
  if (2 < points_count) {
    _Var1 = rf_gfx_check_buffer_limit((points_count + -2) * 4);
    if (_Var1) {
      rf_gfx_draw();
    }
    rf_get_shapes_texture();
    rf_gfx_enable_texture(i._4_4_);
    rf_gfx_begin(RF_QUADS);
    points_local._4_1_ = color.r;
    points_local._5_1_ = color.g;
    points_local._6_1_ = color.b;
    points_local._7_1_ = color.a;
    rf_gfx_color4ub(points_local._4_1_,points_local._5_1_,points_local._6_1_,points_local._7_1_);
    for (local_40 = 1; local_40 < points_count + -1; local_40 = local_40 + 1) {
      rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                         (float)(rf__ctx->field_0).tex_shapes.width,
                         (rf__ctx->field_0).rec_tex_shapes.y /
                         (float)(rf__ctx->field_0).tex_shapes.height);
      rf_gfx_vertex2f(points->x,points->y);
      rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                         (float)(rf__ctx->field_0).tex_shapes.width,
                         ((rf__ctx->field_0).rec_tex_shapes.y +
                         (rf__ctx->field_0).rec_tex_shapes.height) /
                         (float)(rf__ctx->field_0).tex_shapes.height);
      rf_gfx_vertex2f(points[local_40].x,points[local_40].y);
      rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x +
                         (rf__ctx->field_0).rec_tex_shapes.width) /
                         (float)(rf__ctx->field_0).tex_shapes.width,
                         ((rf__ctx->field_0).rec_tex_shapes.y +
                         (rf__ctx->field_0).rec_tex_shapes.height) /
                         (float)(rf__ctx->field_0).tex_shapes.height);
      rf_gfx_vertex2f(points[local_40 + 1].x,points[local_40 + 1].y);
      rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x +
                         (rf__ctx->field_0).rec_tex_shapes.width) /
                         (float)(rf__ctx->field_0).tex_shapes.width,
                         (rf__ctx->field_0).rec_tex_shapes.y /
                         (float)(rf__ctx->field_0).tex_shapes.height);
      rf_gfx_vertex2f(points[local_40 + 1].x,points[local_40 + 1].y);
    }
    rf_gfx_end();
    rf_gfx_disable_texture();
  }
  return;
}

Assistant:

RF_API void rf_draw_triangle_fan(rf_vec2 *points, int points_count, rf_color color)
{
    if (points_count >= 3)
    {
        if (rf_gfx_check_buffer_limit((points_count - 2) * 4)) rf_gfx_draw();

        rf_gfx_enable_texture(rf_get_shapes_texture().id);
        rf_gfx_begin(RF_QUADS);
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        for (rf_int i = 1; i < points_count - 1; i++)
        {
            rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[0].x, points[0].y);

            rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[i].x, points[i].y);

            rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[i + 1].x, points[i + 1].y);

            rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[i + 1].x, points[i + 1].y);
        }
        rf_gfx_end();
        rf_gfx_disable_texture();
    }
}